

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

_binbuf * canvas_docopy(_glist *x)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  _binbuf *x_00;
  _outconnect *p_Var4;
  t_symbol *ptVar5;
  t_symbol *ptVar6;
  _binbuf *b;
  _outconnect *oc;
  t_linetraverser t;
  t_gobj *y;
  _glist *x_local;
  
  x_00 = binbuf_new();
  for (t._112_8_ = x->gl_list; t._112_8_ != 0; t._112_8_ = *(undefined8 *)(t._112_8_ + 8)) {
    iVar2 = glist_isselected(x,(t_gobj *)t._112_8_);
    if (iVar2 != 0) {
      gobj_save((t_gobj *)t._112_8_,x_00);
    }
  }
  linetraverser_start((t_linetraverser *)&oc,x);
  while (p_Var4 = linetraverser_next((t_linetraverser *)&oc), p_Var4 != (_outconnect *)0x0) {
    iVar2 = glist_isselected(x,(t_gobj *)t.tr_x);
    if ((iVar2 != 0) && (iVar2 = glist_isselected(x,(t_gobj *)t._16_8_), iVar2 != 0)) {
      ptVar5 = gensym("#X");
      ptVar6 = gensym("connect");
      uVar3 = glist_selectionindex(x,(t_gobj *)t.tr_x,1);
      uVar1 = t.tr_ob._4_4_;
      iVar2 = glist_selectionindex(x,(t_gobj *)t._16_8_,1);
      binbuf_addv(x_00,"ssiiii;",ptVar5,ptVar6,(ulong)uVar3,(ulong)uVar1,iVar2,t.tr_inlet._4_4_);
    }
  }
  return x_00;
}

Assistant:

static t_binbuf *canvas_docopy(t_canvas *x)
{
    t_gobj *y;
    t_linetraverser t;
    t_outconnect *oc;
    t_binbuf *b = binbuf_new();
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (glist_isselected(x, y))
            gobj_save(y, b);
    }
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (glist_isselected(x, &t.tr_ob->ob_g)
            && glist_isselected(x, &t.tr_ob2->ob_g))
        {
            binbuf_addv(b, "ssiiii;", gensym("#X"), gensym("connect"),
                glist_selectionindex(x, &t.tr_ob->ob_g, 1), t.tr_outno,
                glist_selectionindex(x, &t.tr_ob2->ob_g, 1), t.tr_inno);
        }
    }
    return (b);
}